

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O0

void __thiscall
CCoinsViewDB::CCoinsViewDB(CCoinsViewDB *this,DBParams *db_params,CoinsViewOptions options)

{
  long lVar1;
  undefined4 in_ECX;
  size_type in_RDX;
  DBParams *in_RSI;
  DBParams *in_RDI;
  long in_FS_OFFSET;
  CCoinsView *in_stack_ffffffffffffffa8;
  DBParams *in_stack_ffffffffffffffd0;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CCoinsView::CCoinsView(in_stack_ffffffffffffffa8);
  (in_RDI->path).super_path._M_pathname._M_dataplus._M_p = (pointer)&PTR_GetCoin_023c75a8;
  DBParams::DBParams(in_RDI,in_RSI);
  in_RDI[1].path.super_path._M_pathname._M_string_length = in_RDX;
  in_RDI[1].path.super_path._M_pathname.field_2._M_allocated_capacity = CONCAT44(uStack_c,in_ECX);
  std::make_unique<CDBWrapper,DBParams&>(in_stack_ffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsViewDB::CCoinsViewDB(DBParams db_params, CoinsViewOptions options) :
    m_db_params{std::move(db_params)},
    m_options{std::move(options)},
    m_db{std::make_unique<CDBWrapper>(m_db_params)} { }